

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::GetStaticLibraryFlags
          (cmLocalGenerator *this,string *flags,string *config,cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  char *pcVar2;
  string name;
  string local_50;
  
  this_00 = this->Makefile;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"CMAKE_STATIC_LINKER_FLAGS","");
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_50);
  (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (config->_M_string_length != 0) {
    std::operator+(&local_50,"CMAKE_STATIC_LINKER_FLAGS_",config);
    pcVar2 = cmMakefile::GetSafeDefinition(this->Makefile,&local_50);
    (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"STATIC_LIBRARY_FLAGS","");
  pcVar2 = cmGeneratorTarget::GetProperty(target,&local_50);
  (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (config->_M_string_length != 0) {
    std::operator+(&local_50,"STATIC_LIBRARY_FLAGS_",config);
    pcVar2 = cmGeneratorTarget::GetProperty(target,&local_50);
    (*this->_vptr_cmLocalGenerator[7])(this,flags,pcVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::GetStaticLibraryFlags(std::string& flags,
                                             std::string const& config,
                                             cmGeneratorTarget* target)
{
  this->AppendFlags(
    flags, this->Makefile->GetSafeDefinition("CMAKE_STATIC_LINKER_FLAGS"));
  if (!config.empty()) {
    std::string name = "CMAKE_STATIC_LINKER_FLAGS_" + config;
    this->AppendFlags(flags, this->Makefile->GetSafeDefinition(name));
  }
  this->AppendFlags(flags, target->GetProperty("STATIC_LIBRARY_FLAGS"));
  if (!config.empty()) {
    std::string name = "STATIC_LIBRARY_FLAGS_" + config;
    this->AppendFlags(flags, target->GetProperty(name));
  }
}